

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O0

char * Curl_alpnid2str(alpnid id)

{
  char *pcStack_10;
  alpnid id_local;
  
  if (id == ALPN_h1) {
    pcStack_10 = "h1";
  }
  else if (id == ALPN_h2) {
    pcStack_10 = "h2";
  }
  else if (id == ALPN_h3) {
    pcStack_10 = "h3";
  }
  else {
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

const char *Curl_alpnid2str(enum alpnid id)
{
  switch(id) {
  case ALPN_h1:
    return "h1";
  case ALPN_h2:
    return "h2";
  case ALPN_h3:
    return H3VERSION;
  default:
    return ""; /* bad */
  }
}